

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Neuron.cpp
# Opt level: O3

bool __thiscall Neuron::tick(Neuron *this,float h)

{
  float fVar1;
  float fVar2;
  Neuron *this_00;
  pointer ppCVar3;
  pointer ppCVar4;
  pointer ppNVar5;
  byte bVar6;
  vector<Neuron_*,_std::allocator<Neuron_*>_> *v;
  pointer pvVar7;
  Neuron **n;
  pointer ppNVar8;
  ulong uVar9;
  const_iterator __end2;
  long lVar10;
  long lVar11;
  pointer pCVar12;
  Connection *this_01;
  float fVar13;
  double dVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  fVar1 = this->m_prevMem;
  if (-40.0 < fVar1) {
    this->m_refractoryPeriod = true;
  }
  if (fVar1 <= 35.0) {
    fVar15 = (fVar1 + 60.0) * 0.5;
    fVar13 = this->m_prevAdd;
    fVar2 = this->m_expireSpeedNotFired;
    fVar17 = this->m_synI;
    fVar16 = ((((fVar1 + 45.0) * fVar15 - fVar13) + this->m_extI + fVar17) / 50.0) * h + fVar1;
    this->m_curMem = fVar16;
    this->m_curAdd = (fVar15 - fVar13) * 0.02 * h + fVar13;
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      dVar14 = exp((double)(-h / fVar2));
      fVar17 = this->m_synI;
      fVar16 = this->m_curMem;
      fVar13 = this->m_prevMem;
    }
    else {
      dVar14 = 1.0;
      fVar13 = fVar1;
    }
    this->m_synI = (float)((double)fVar17 * dVar14);
    if ((-57.0 < fVar13) && (fVar16 <= -57.0)) {
      ppCVar3 = (this->m_incomingSpikes).
                super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar4 = (this->m_incomingSpikes).
                super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      lVar11 = (long)ppCVar4 - (long)ppCVar3;
      if (lVar11 != 0) {
        lVar11 = lVar11 >> 3;
        lVar10 = 0;
        do {
          fVar2 = ppCVar3[lVar10]->m_weight;
          ppCVar3[lVar10]->m_weight = fVar2 + *(float *)(&DAT_00142b68 + (ulong)(fVar2 < 0.0) * 4);
          lVar10 = lVar10 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar10);
        if (ppCVar4 != ppCVar3) {
          (this->m_incomingSpikes).super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppCVar3;
        }
      }
    }
    if (fVar13 <= -60.0) {
      this->m_firing = false;
      bVar6 = 0;
    }
    else {
      bVar6 = this->m_firing;
    }
    if (((bVar6 & 1) == 0) && (-60.0 < this->m_prevMem)) {
      this->m_refractoryPeriod = false;
    }
  }
  else {
    this->m_firing = true;
    this->m_curMem = -40.0;
    fVar13 = this->m_expireSpeedFired;
    this->m_curAdd = this->m_prevAdd + 100.0;
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      dVar14 = exp((double)(-h / fVar13));
    }
    else {
      dVar14 = 0.0;
    }
    this->m_synI = (float)((double)this->m_synI * dVar14);
    pCVar12 = (this->m_connections).super__Vector_base<Connection,_std::allocator<Connection>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar12) {
      lVar11 = 0;
      uVar9 = 0;
      do {
        this_00 = *(Neuron **)((long)&pCVar12->m_target + lVar11);
        this_01 = (Connection *)((long)&pCVar12->m_target + lVar11);
        fVar13 = Connection::weight(this_01);
        apply(this_00,fVar13,this_01);
        uVar9 = uVar9 + 1;
        pCVar12 = (this->m_connections).super__Vector_base<Connection,_std::allocator<Connection>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x18;
      } while (uVar9 < (ulong)(((long)(this->m_connections).
                                      super__Vector_base<Connection,_std::allocator<Connection>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pCVar12 >> 3
                               ) * -0x5555555555555555));
    }
    ppCVar3 = (this->m_incomingSpikes).
              super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar4 = (this->m_incomingSpikes).
              super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    lVar11 = (long)ppCVar4 - (long)ppCVar3;
    if (lVar11 != 0) {
      lVar11 = lVar11 >> 3;
      lVar10 = 0;
      do {
        fVar13 = ppCVar3[lVar10]->m_weight;
        ppCVar3[lVar10]->m_weight = fVar13 + *(float *)(&DAT_00142b70 + (ulong)(fVar13 < 0.0) * 4);
        lVar10 = lVar10 + 1;
      } while (lVar11 + (ulong)(lVar11 == 0) != lVar10);
      if (ppCVar4 != ppCVar3) {
        (this->m_incomingSpikes).super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = ppCVar3;
      }
    }
  }
  this->m_prevMem = this->m_curMem;
  this->m_prevAdd = this->m_curAdd;
  if (this->m_refractoryPeriod == false) {
    for (pvVar7 = (this->m_watchFor).
                  super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar7 != (this->m_watchFor).
                  super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pvVar7 = pvVar7 + 1) {
      ppNVar8 = (pvVar7->super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      ppNVar5 = (pvVar7->super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppNVar8 != ppNVar5) {
        while ((*ppNVar8)->m_firing != false) {
          ppNVar8 = ppNVar8 + 1;
          if (ppNVar8 == ppNVar5) {
            this->m_prevMem = 35.1;
            goto LAB_00123ca8;
          }
        }
      }
    }
  }
LAB_00123ca8:
  return 35.0 < fVar1;
}

Assistant:

bool Neuron::tick(float h)
{
    bool fired = m_prevMem > kSpikeThreshold;
    if (m_prevMem > kMembraneAfterSpike)
        m_refractoryPeriod = true;

    if (fired) {
        m_firing = true;
        m_curMem = kMembraneAfterSpike;
        m_curAdd = m_prevAdd + 100.0f;
        m_synI *= m_expireSpeedFired ? exp(-h / m_expireSpeedFired) : 0;

        for (size_t i = 0; i < m_connections.size(); ++i)
            m_connections[i].spike();

        for (size_t i = 0; i < m_incomingSpikes.size(); ++i)
            m_incomingSpikes[i]->teach(1);

        m_incomingSpikes.clear();
    } else {
        m_curMem = m_prevMem + h * prevMem();
        m_curAdd = m_prevAdd + h * prevAdd();
        m_synI *= m_expireSpeedNotFired ? exp(-h / m_expireSpeedNotFired) : 1;

        // All prev spikes could not activate current neuron.
        // TODO: val should be param?
        const float activateThreshold = -57.0f;
        if (m_prevMem > activateThreshold && m_curMem <= activateThreshold) {
            for (size_t i = 0; i < m_incomingSpikes.size(); ++i)
                m_incomingSpikes[i]->teach(-1);

            m_incomingSpikes.clear();
        }

        if (m_prevMem <= kDefaultMembrane)
            m_firing = false;

        if (!m_firing && m_prevMem > kDefaultMembrane)
            m_refractoryPeriod = false;
    }

    m_prevMem = m_curMem;
    m_prevAdd = m_curAdd;

    if (!m_refractoryPeriod && watchForSpiked())
        spike();

    return fired;
}